

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O3

int execute(string *executable,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args,string *input,string *output)

{
  pointer pbVar1;
  int iVar2;
  __pid_t _Var3;
  __sighandler_t p_Var4;
  ssize_t sVar5;
  size_type sVar6;
  string *psVar7;
  int *piVar8;
  char *pcVar9;
  char **__argv;
  ostream *poVar10;
  pointer pbVar11;
  ulong uVar12;
  uint uVar13;
  size_type sVar14;
  ulong uVar15;
  ssize_t sVar16;
  bool bVar17;
  int status;
  int pout [2];
  int pin [2];
  timeval tv;
  fd_set wfds;
  fd_set rfds;
  char buf [16384];
  uint local_4168;
  allocator<char> local_4161;
  uint local_4160;
  int local_415c;
  int local_4158;
  uint local_4154;
  pointer local_4150;
  timeval local_4148;
  fd_set local_4138;
  fd_set local_40b8;
  undefined1 local_4038 [16392];
  
  local_4150 = (input->_M_dataplus)._M_p;
  p_Var4 = signal(0xd,(__sighandler_t)0x1);
  if (p_Var4 == (__sighandler_t)0xffffffffffffffff) {
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    std::__cxx11::string::string<std::allocator<char>>(psVar7,pcVar9,(allocator<char> *)&local_4168)
    ;
  }
  else {
    iVar2 = pipe(&local_4158);
    if (iVar2 == -1) {
      psVar7 = (string *)__cxa_allocate_exception(0x20);
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      std::__cxx11::string::string<std::allocator<char>>
                (psVar7,pcVar9,(allocator<char> *)&local_4168);
    }
    else {
      iVar2 = pipe((int *)&local_4160);
      if (iVar2 == -1) {
        psVar7 = (string *)__cxa_allocate_exception(0x20);
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        std::__cxx11::string::string<std::allocator<char>>
                  (psVar7,pcVar9,(allocator<char> *)&local_4168);
      }
      else {
        _Var3 = fork();
        if (_Var3 == 0) {
          close(local_4154);
          close(local_4160);
          iVar2 = dup2(local_4158,0);
          if (iVar2 == -1) {
            psVar7 = (string *)__cxa_allocate_exception(0x20);
            piVar8 = __errno_location();
            pcVar9 = strerror(*piVar8);
            std::__cxx11::string::string<std::allocator<char>>
                      (psVar7,pcVar9,(allocator<char> *)&local_4168);
          }
          else {
            close(local_4158);
            iVar2 = dup2(local_415c,1);
            if (iVar2 != -1) {
              close(local_415c);
              pbVar11 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pbVar1 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              uVar15 = (long)pbVar1 - (long)pbVar11 >> 5;
              __argv = (char **)operator_new__(-(ulong)(uVar15 + 2 >> 0x3d != 0) | uVar15 * 8 + 0x10
                                              );
              pcVar9 = (executable->_M_dataplus)._M_p;
              *__argv = pcVar9;
              if (pbVar1 != pbVar11) {
                uVar13 = 1;
                do {
                  uVar12 = (ulong)uVar13;
                  __argv[uVar12] = (pbVar11->_M_dataplus)._M_p;
                  pbVar11 = pbVar11 + 1;
                  uVar13 = uVar13 + 1;
                } while (uVar12 < uVar15);
              }
              __argv[uVar15 + 1] = (char *)0x0;
              iVar2 = execvp(pcVar9,__argv);
              poVar10 = std::operator<<((ostream *)&std::cerr,"Failed to execute \'");
              poVar10 = std::operator<<(poVar10,(string *)executable);
              poVar10 = std::operator<<(poVar10,"\' Error: ");
              piVar8 = __errno_location();
              pcVar9 = strerror(*piVar8);
              poVar10 = std::operator<<(poVar10,pcVar9);
              std::operator<<(poVar10,'\n');
              _exit(iVar2);
            }
            psVar7 = (string *)__cxa_allocate_exception(0x20);
            piVar8 = __errno_location();
            pcVar9 = strerror(*piVar8);
            std::__cxx11::string::string<std::allocator<char>>
                      (psVar7,pcVar9,(allocator<char> *)&local_4168);
          }
        }
        else {
          if (_Var3 != -1) {
            close(local_4158);
            close(local_415c);
            if (input->_M_string_length == 0) {
              close(local_4154);
            }
            bVar17 = false;
            std::__cxx11::string::_M_replace
                      ((ulong)output,0,(char *)output->_M_string_length,0x117011);
            sVar16 = 0xffffffff;
            sVar14 = 0;
            do {
              local_40b8.fds_bits[0xe] = 0;
              local_40b8.fds_bits[0xf] = 0;
              local_40b8.fds_bits[0xc] = 0;
              local_40b8.fds_bits[0xd] = 0;
              local_40b8.fds_bits[10] = 0;
              local_40b8.fds_bits[0xb] = 0;
              local_40b8.fds_bits[8] = 0;
              local_40b8.fds_bits[9] = 0;
              local_40b8.fds_bits[6] = 0;
              local_40b8.fds_bits[7] = 0;
              local_40b8.fds_bits[4] = 0;
              local_40b8.fds_bits[5] = 0;
              local_40b8.fds_bits[2] = 0;
              local_40b8.fds_bits[3] = 0;
              local_40b8.fds_bits[0] = 0;
              local_40b8.fds_bits[1] = 0;
              if (!bVar17) {
                uVar13 = local_4160 + 0x3f;
                if (-1 < (int)local_4160) {
                  uVar13 = local_4160;
                }
                local_40b8.fds_bits[(int)uVar13 >> 6] =
                     local_40b8.fds_bits[(int)uVar13 >> 6] |
                     1L << ((byte)((int)local_4160 % 0x40) & 0x3f);
              }
              local_4138.fds_bits[0xe] = 0;
              local_4138.fds_bits[0xf] = 0;
              local_4138.fds_bits[0xc] = 0;
              local_4138.fds_bits[0xd] = 0;
              local_4138.fds_bits[10] = 0;
              local_4138.fds_bits[0xb] = 0;
              local_4138.fds_bits[8] = 0;
              local_4138.fds_bits[9] = 0;
              local_4138.fds_bits[6] = 0;
              local_4138.fds_bits[7] = 0;
              local_4138.fds_bits[4] = 0;
              local_4138.fds_bits[5] = 0;
              local_4138.fds_bits[2] = 0;
              local_4138.fds_bits[3] = 0;
              local_4138.fds_bits[0] = 0;
              local_4138.fds_bits[1] = 0;
              if (input->_M_string_length != sVar14) {
                uVar13 = local_4154 + 0x3f;
                if (-1 < (int)local_4154) {
                  uVar13 = local_4154;
                }
                local_4138.fds_bits[(int)uVar13 >> 6] =
                     local_4138.fds_bits[(int)uVar13 >> 6] |
                     1L << ((byte)((int)local_4154 % 0x40) & 0x3f);
              }
              local_4148.tv_sec = 5;
              local_4148.tv_usec = 0;
              uVar13 = local_4154;
              if ((int)local_4154 < (int)local_4160) {
                uVar13 = local_4160;
              }
              iVar2 = select(uVar13 + 1,&local_40b8,&local_4138,(fd_set *)0x0,&local_4148);
              if (iVar2 == -1) {
                psVar7 = (string *)__cxa_allocate_exception(0x20);
                piVar8 = __errno_location();
                pcVar9 = strerror(*piVar8);
                std::__cxx11::string::string<std::allocator<char>>
                          (psVar7,pcVar9,(allocator<char> *)&local_4168);
                goto LAB_0011601c;
              }
              uVar13 = local_4154 + 0x3f;
              if (-1 < (int)local_4154) {
                uVar13 = local_4154;
              }
              if (((ulong)local_4138.fds_bits[(int)uVar13 >> 6] >> ((ulong)local_4154 & 0x3f) & 1)
                  != 0) {
                sVar5 = write(local_4154,local_4150 + sVar14,input->_M_string_length - sVar14);
                iVar2 = (int)sVar5;
                if (iVar2 == -1) {
                  piVar8 = __errno_location();
                  if (*piVar8 != 0x20) {
                    psVar7 = (string *)__cxa_allocate_exception(0x20);
                    pcVar9 = strerror(*piVar8);
                    std::__cxx11::string::string<std::allocator<char>>
                              (psVar7,pcVar9,(allocator<char> *)&local_4168);
                    goto LAB_0011601c;
                  }
                  sVar6 = input->_M_string_length;
                  iVar2 = (int)sVar6 - (int)sVar14;
                }
                else {
                  sVar6 = input->_M_string_length;
                }
                uVar13 = iVar2 + (int)sVar14;
                if (sVar6 == uVar13) {
                  close(local_4154);
                }
                sVar14 = (size_type)uVar13;
              }
              uVar13 = local_4160 + 0x3f;
              if (-1 < (int)local_4160) {
                uVar13 = local_4160;
              }
              if (((ulong)local_40b8.fds_bits[(int)uVar13 >> 6] >> ((ulong)local_4160 & 0x3f) & 1)
                  != 0) {
                sVar16 = read(local_4160,local_4038,0x3fff);
                if ((int)sVar16 == -1) {
                  psVar7 = (string *)__cxa_allocate_exception(0x20);
                  piVar8 = __errno_location();
                  pcVar9 = strerror(*piVar8);
                  std::__cxx11::string::string<std::allocator<char>>
                            (psVar7,pcVar9,(allocator<char> *)&local_4168);
                  goto LAB_0011601c;
                }
                local_4038[(int)sVar16] = 0;
                std::__cxx11::string::append((char *)output);
              }
              bVar17 = (int)sVar16 == 0;
              if ((bVar17) && (input->_M_string_length == sVar14)) {
                close(local_4160);
                local_4168 = 0xffffffff;
                _Var3 = wait(&local_4168);
                if (_Var3 == -1) {
                  psVar7 = (string *)__cxa_allocate_exception(0x20);
                  piVar8 = __errno_location();
                  pcVar9 = strerror(*piVar8);
                  std::__cxx11::string::string<std::allocator<char>>(psVar7,pcVar9,&local_4161);
                  __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
                }
                if ((local_4168 & 0x7f) == 0) {
                  local_4168 = local_4168 >> 8 & 0xff;
                  p_Var4 = signal(0xd,(__sighandler_t)0x0);
                  if (p_Var4 != (__sighandler_t)0xffffffffffffffff) {
                    return local_4168;
                  }
                  psVar7 = (string *)__cxa_allocate_exception(0x20);
                  piVar8 = __errno_location();
                  pcVar9 = strerror(*piVar8);
                  std::__cxx11::string::string<std::allocator<char>>(psVar7,pcVar9,&local_4161);
                  __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
                }
                psVar7 = (string *)__cxa_allocate_exception(0x20);
                *(string **)psVar7 = psVar7 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          (psVar7,"Error: Could not get Hook exit status!","");
                __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
            } while( true );
          }
          psVar7 = (string *)__cxa_allocate_exception(0x20);
          piVar8 = __errno_location();
          pcVar9 = strerror(*piVar8);
          std::__cxx11::string::string<std::allocator<char>>
                    (psVar7,pcVar9,(allocator<char> *)&local_4168);
        }
      }
    }
  }
LAB_0011601c:
  __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

int execute (
  const std::string& executable,
  const std::vector <std::string>& args,
  const std::string& input,
  std::string& output)
{
  pid_t pid;
  int pin[2], pout[2];
  fd_set rfds, wfds;
  struct timeval tv;
  int select_retval, read_retval, write_retval;
  char buf[16384];
  unsigned int written;
  const char* input_cstr = input.c_str ();

  if (signal (SIGPIPE, SIG_IGN) == SIG_ERR) // Handled locally with EPIPE.
    throw std::string (std::strerror (errno));

  if (pipe (pin) == -1)
    throw std::string (std::strerror (errno));

  if (pipe (pout) == -1)
    throw std::string (std::strerror (errno));

  if ((pid = fork ()) == -1)
    throw std::string (std::strerror (errno));

  if (pid == 0)
  {
    // This is only reached in the child
    close (pin[1]);   // Close the write end of the input pipe.
    close (pout[0]);  // Close the read end of the output pipe.

    // Parent writes to pin[1]. Set read end pin[0] as STDIN for child.
    if (dup2 (pin[0], STDIN_FILENO) == -1)
      throw std::string (std::strerror (errno));
    close (pin[0]);

    // Parent reads from pout[0]. Set write end pout[1] as STDOUT for child.
    if (dup2 (pout[1], STDOUT_FILENO) == -1)
      throw std::string (std::strerror (errno));
    close (pout[1]);

    // Add executable as argv[0] and NULL-terminate the array for execvp().
    char** argv = new char* [args.size () + 2];
    argv[0] = (char*) executable.c_str ();
    for (unsigned int i = 0; i < args.size (); ++i)
      argv[i+1] = (char*) args[i].c_str ();

    argv[args.size () + 1] = nullptr;
    int rc = execvp (executable.c_str (), argv);
    std::cerr << "Failed to execute '" << executable << "' Error: " << strerror (errno) << '\n';
    _exit (rc);
  }

  // This is only reached in the parent
  close (pin[0]);   // Close the read end of the input pipe.
  close (pout[1]);  // Close the write end of the output pipe.

  if (input.empty ())
  {
    // Nothing to send to the child, close the pipe early.
    close (pin[1]);
  }

  output = "";
  read_retval = -1;
  written = 0;
  while (read_retval != 0 || input.size () != written)
  {
    FD_ZERO (&rfds);
    if (read_retval != 0)
      FD_SET (pout[0], &rfds);

    FD_ZERO (&wfds);
    if (input.size () != written)
      FD_SET (pin[1], &wfds);

    // On Linux, tv may be overwritten by select().  Reset it each time.
    // NOTE: Timeout chosen arbitrarily - we don't time out execute() calls.
    // select() is run over and over again unless the child exits or closes
    // its pipes.
    tv.tv_sec = 5;
    tv.tv_usec = 0;

    select_retval = select (std::max (pout[0], pin[1]) + 1, &rfds, &wfds, nullptr, &tv);

    if (select_retval == -1)
      throw std::string (std::strerror (errno));

    // Write data to child's STDIN
    if (FD_ISSET (pin[1], &wfds))
    {
      write_retval = write (pin[1], input_cstr + written, input.size () - written);
      if (write_retval == -1)
      {
        if (errno == EPIPE)
        {
          // Child died (or closed the pipe) before reading all input.
          // We don't really care; pretend we wrote it all.
          write_retval = input.size () - written;
        }
        else
        {
          throw std::string (std::strerror (errno));
        }
      }
      written += write_retval;

      if (written == input.size ())
      {
        // Let the child know that no more input is coming by closing the pipe.
        close (pin[1]);
      }
    }

    // Read data from child's STDOUT
    if (FD_ISSET (pout[0], &rfds))
    {
      read_retval = read (pout[0], &buf, sizeof (buf) - 1);
      if (read_retval == -1)
        throw std::string (std::strerror (errno));

      buf[read_retval] = '\0';
      output += buf;
    }
  }

  close (pout[0]);  // Close the read end of the output pipe.

  int status = -1;
  if (wait (&status) == -1)
    throw std::string (std::strerror (errno));

  if (WIFEXITED (status))
  {
    status = WEXITSTATUS (status);
  }
  else
  {
    throw std::string ("Error: Could not get Hook exit status!");
  }

  if (signal (SIGPIPE, SIG_DFL) == SIG_ERR)  // We're done, return to default.
    throw std::string (std::strerror (errno));

  return status;
}